

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O0

USTATUS __thiscall FfsParser::performSecondPass(FfsParser *this,UModelIndex *index)

{
  bool bVar1;
  int32_t iVar2;
  int32_t iVar3;
  int32_t iVar4;
  UINT32 UVar5;
  UByteArray local_a8;
  UByteArray local_88;
  UByteArray local_68;
  uint local_48;
  UINT32 vtfSize;
  CBString local_38;
  UModelIndex *local_20;
  UModelIndex *index_local;
  FfsParser *this_local;
  
  local_20 = index;
  index_local = (UModelIndex *)this;
  bVar1 = UModelIndex::isValid(index);
  if ((bVar1) && (bVar1 = UModelIndex::isValid(&this->lastVtf), bVar1)) {
    bVar1 = TreeModel::compressed(this->model,&this->lastVtf);
    if (bVar1) {
      usprintf(&local_38,"%s: the last VTF appears inside compressed item, the image may be damaged"
               ,"performSecondPass");
      msg(this,&local_38,&this->lastVtf);
      Bstrlib::CBString::~CBString(&local_38);
      this_local = (FfsParser *)0x0;
    }
    else {
      TreeModel::header(&local_68,this->model,&this->lastVtf);
      iVar2 = UByteArray::size(&local_68);
      TreeModel::body(&local_88,this->model,&this->lastVtf);
      iVar3 = UByteArray::size(&local_88);
      TreeModel::tail(&local_a8,this->model,&this->lastVtf);
      iVar4 = UByteArray::size(&local_a8);
      UByteArray::~UByteArray(&local_a8);
      UByteArray::~UByteArray(&local_88);
      UByteArray::~UByteArray(&local_68);
      local_48 = iVar2 + iVar3 + iVar4;
      UVar5 = TreeModel::base(this->model,&this->lastVtf);
      this->addressDiff = (-(ulong)local_48 - (ulong)UVar5) + 0x100000000;
      parseResetVectorData(this);
      FitParser::parseFit(this->fitParser,local_20);
      checkProtectedRanges(this,local_20);
      checkTeImageBase(this,local_20);
      this_local = (FfsParser *)0x0;
    }
  }
  else {
    this_local = (FfsParser *)0x1;
  }
  return (USTATUS)this_local;
}

Assistant:

USTATUS FfsParser::performSecondPass(const UModelIndex & index)
{
    // Sanity check
    if (!index.isValid() || !lastVtf.isValid())
        return U_INVALID_PARAMETER;
    
    // Check for compressed lastVtf
    if (model->compressed(lastVtf)) {
        msg(usprintf("%s: the last VTF appears inside compressed item, the image may be damaged", __FUNCTION__), lastVtf);
        return U_SUCCESS;
    }
    
    // Calculate address difference
    const UINT32 vtfSize = (UINT32)(model->header(lastVtf).size() + model->body(lastVtf).size() + model->tail(lastVtf).size());
    addressDiff = 0xFFFFFFFFULL - model->base(lastVtf) - vtfSize + 1;
    
    // Parse reset vector data
    parseResetVectorData();
    
    // Find and parse FIT
    fitParser->parseFit(index);
    
    // Check protected ranges
    checkProtectedRanges(index);
    
    // Check TE files to have original or adjusted base
    checkTeImageBase(index);
    
    return U_SUCCESS;
}